

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

bool __thiscall cmFindProgramHelper::CheckCompoundNames(cmFindProgramHelper *this)

{
  string *psVar1;
  long lVar2;
  bool bVar3;
  string *name;
  allocator<char> local_51;
  string local_50;
  
  psVar1 = (this->Names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (name = (this->Names).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; name != psVar1; name = name + 1) {
    lVar2 = std::__cxx11::string::find((char)name,0x2f);
    if (lVar2 != -1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
      bVar3 = CheckDirectoryForName(this,&local_50,name);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar3) break;
    }
  }
  return name != psVar1;
}

Assistant:

bool CheckCompoundNames()
  {
    for (std::string const& n : this->Names) {
      // Only perform search relative to current directory if the file name
      // contains a directory separator.
      if (n.find('/') != std::string::npos) {
        if (this->CheckDirectoryForName("", n)) {
          return true;
        }
      }
    }
    return false;
  }